

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xwinman.c
# Opt level: O0

void process_Xevents(DspInterface dsp)

{
  DLword DVar1;
  int iVar2;
  UNSIGNED real68kbase_13;
  UNSIGNED real68kbase_12;
  UNSIGNED real68kbase_11;
  UNSIGNED real68kbase_10;
  UNSIGNED real68kbase_9;
  UNSIGNED real68kbase_8;
  UNSIGNED real68kbase_7;
  UNSIGNED real68kbase_6;
  UNSIGNED real68kbase_5;
  UNSIGNED real68kbase_4;
  UNSIGNED real68kbase_3;
  UNSIGNED real68kbase_2;
  UNSIGNED real68kbase_1;
  UNSIGNED real68kbase;
  XEvent report;
  DspInterface dsp_local;
  
  report.pad[0x17] = (long)dsp;
  while( true ) {
    iVar2 = XPending(*(undefined8 *)(report.pad[0x17] + 0xe0));
    if (iVar2 == 0) {
      return;
    }
    XNextEvent(*(undefined8 *)(report.pad[0x17] + 0xe0));
    if (report.xany.display == *(Display **)(report.pad[0x17] + 0xf0)) break;
    if (report.xany.display == *(Display **)(report.pad[0x17] + 0xe8)) {
      switch((int)real68kbase) {
      case 7:
        enable_Xkeyboard(currentdsp);
        break;
      case 8:
        break;
      default:
        break;
      case 0x12:
        break;
      case 0x13:
        break;
      case 0x16:
        lisp_Xconfigure((DspInterface)report.pad[0x17],report.xfocus.mode,report.xfocus.detail,
                        report.xexpose.width,report.xexpose.height);
      }
      goto LAB_0017229f;
    }
    if (noscroll == 0) {
      if (report.xany.display == *(Display **)(report.pad[0x17] + 0xf8)) {
        if ((int)real68kbase == 4) {
          if (report.xkey.y_root == 1) {
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),
                          *(undefined8 *)(report.pad[0x17] + 0xf8),ScrollLeftCursor);
            ScrollLeft((DspInterface)report.pad[0x17]);
          }
          else if (report.xkey.y_root == 2) {
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),
                          *(undefined8 *)(report.pad[0x17] + 0xf8),HorizThumbCursor);
          }
          else if (report.xkey.y_root == 3) {
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),
                          *(undefined8 *)(report.pad[0x17] + 0xf8),ScrollRightCursor);
            ScrollRight((DspInterface)report.pad[0x17]);
          }
        }
        else if ((int)real68kbase == 5) {
          if (report.xkey.y_root == 1) {
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),report.xany.display,
                          HorizScrollCursor);
          }
          else if (report.xkey.y_root == 2) {
            JumpScrollHor((DspInterface)report.pad[0x17],report.xexpose.count);
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),report.xany.display,
                          HorizScrollCursor);
          }
          else if (report.xkey.y_root == 3) {
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),report.xany.display,
                          HorizScrollCursor);
          }
        }
      }
      else if (report.xany.display == *(Display **)(report.pad[0x17] + 0x100)) {
        if ((int)real68kbase == 4) {
          if (report.xkey.y_root == 1) {
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),report.xany.display,
                          ScrollUpCursor);
            ScrollUp((DspInterface)report.pad[0x17]);
          }
          else if (report.xkey.y_root == 2) {
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),report.xany.display,
                          VertThumbCursor);
          }
          else if (report.xkey.y_root == 3) {
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),report.xany.display,
                          ScrollDownCursor);
            ScrollDown((DspInterface)report.pad[0x17]);
          }
        }
        else if ((int)real68kbase == 5) {
          if (report.xkey.y_root == 1) {
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),report.xany.display,
                          VertScrollCursor);
          }
          else if (report.xkey.y_root == 2) {
            JumpScrollVer((DspInterface)report.pad[0x17],report.xgraphicsexpose.major_code);
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),report.xany.display,
                          VertScrollCursor);
          }
          else if (report.xkey.y_root == 3) {
            XDefineCursor(*(undefined8 *)(report.pad[0x17] + 0xe0),report.xany.display,
                          VertScrollCursor);
          }
        }
      }
      else if (((report.xany.display == *(Display **)(report.pad[0x17] + 0x118)) &&
               ((int)real68kbase == 4)) && ((report.xkey.y_root & 0xffU) == 1)) {
        Set_BitGravity((XButtonEvent *)&real68kbase,(DspInterface)report.pad[0x17],
                       *(Window *)(report.pad[0x17] + 0x118),3);
      }
      else if (((report.xany.display == *(Display **)(report.pad[0x17] + 0x120)) &&
               ((int)real68kbase == 4)) && ((report.xkey.y_root & 0xffU) == 1)) {
        Set_BitGravity((XButtonEvent *)&real68kbase,(DspInterface)report.pad[0x17],
                       *(Window *)(report.pad[0x17] + 0x120),9);
      }
      else if (((report.xany.display == *(Display **)(report.pad[0x17] + 0x128)) &&
               ((int)real68kbase == 4)) && ((report.xkey.y_root & 0xffU) == 1)) {
        Set_BitGravity((XButtonEvent *)&real68kbase,(DspInterface)report.pad[0x17],
                       *(Window *)(report.pad[0x17] + 0x128),7);
      }
      else if (((report.xany.display == *(Display **)(report.pad[0x17] + 0x130)) &&
               ((int)real68kbase == 4)) && ((report.xkey.y_root & 0xffU) == 1)) {
        Set_BitGravity((XButtonEvent *)&real68kbase,(DspInterface)report.pad[0x17],
                       *(Window *)(report.pad[0x17] + 0x130),1);
      }
LAB_0017229f:
      XFlush(*(undefined8 *)(report.pad[0x17] + 0xe0));
    }
  }
  switch((int)real68kbase) {
  case 2:
    kb_trans((ushort)SUNLispKeyMap[report.xkey.y_root - 7],0);
    DoRing();
    KBDEventFlg = KBDEventFlg + 1;
    if (0 < KBDEventFlg) {
      MachineState.irqcheck = 0;
      MachineState.irqend = 0;
    }
    break;
  case 3:
    kb_trans((ushort)SUNLispKeyMap[report.xkey.y_root - 7],1);
    DoRing();
    KBDEventFlg = KBDEventFlg + 1;
    if (0 < KBDEventFlg) {
      MachineState.irqcheck = 0;
      MachineState.irqend = 0;
    }
    break;
  case 4:
    switch(report.xkey.y_root) {
    case 1:
      *EmRealUtilin68K = *EmRealUtilin68K & 0xfffb;
      break;
    case 2:
      *EmRealUtilin68K = *EmRealUtilin68K & 0xfffe;
      break;
    case 3:
      *EmRealUtilin68K = *EmRealUtilin68K & 0xfffd;
      break;
    case 4:
      *EmRealUtilin68K = *EmRealUtilin68K & 0xff7f;
      break;
    case 5:
      *EmRealUtilin68K = *EmRealUtilin68K & 0xffbf;
      break;
    case 6:
      *EmRealUtilin68K = *EmRealUtilin68K & 0xfff7;
      break;
    case 7:
      *EmRealUtilin68K = *EmRealUtilin68K & 0xffef;
    }
    DoRing();
    KBDEventFlg = KBDEventFlg + 1;
    if (0 < KBDEventFlg) {
      MachineState.irqcheck = 0;
      MachineState.irqend = 0;
    }
    break;
  case 5:
    switch(report.xkey.y_root) {
    case 1:
      *EmRealUtilin68K = *EmRealUtilin68K | 4;
      break;
    case 2:
      *EmRealUtilin68K = *EmRealUtilin68K | 1;
      break;
    case 3:
      *EmRealUtilin68K = *EmRealUtilin68K | 2;
      break;
    case 4:
      *EmRealUtilin68K = *EmRealUtilin68K | 0x80;
      break;
    case 5:
      *EmRealUtilin68K = *EmRealUtilin68K | 0x40;
      break;
    case 6:
      *EmRealUtilin68K = *EmRealUtilin68K | 8;
      break;
    case 7:
      *EmRealUtilin68K = *EmRealUtilin68K | 0x10;
    }
    DoRing();
    KBDEventFlg = KBDEventFlg + 1;
    if (0 < KBDEventFlg) {
      MachineState.irqcheck = 0;
      MachineState.irqend = 0;
    }
    break;
  case 6:
    *CLastUserActionCell68k = MiscStats->secondstmp;
    DVar1 = ((short)report.xexpose.count + (short)*(undefined4 *)(report.pad[0x17] + 0x140)) -
            (short)Current_Hot_X;
    *EmMouseX68K = DVar1;
    *EmCursorX68K = DVar1;
    DVar1 = ((short)report.xgraphicsexpose.major_code +
            (short)*(undefined4 *)(report.pad[0x17] + 0x144)) - (short)Current_Hot_Y;
    *EmMouseY68K = DVar1;
    *EmCursorY68K = DVar1;
    break;
  case 7:
    Mouse_Included = 1;
    break;
  case 8:
    Mouse_Included = 0;
    break;
  default:
    break;
  case 0xc:
    (**(code **)(report.pad[0x17] + 0x70))
              (report.pad[0x17],0,report.xgeneric.extension + *(int *)(report.pad[0x17] + 0x140),
               report.xgeneric.evtype + *(int *)(report.pad[0x17] + 0x144),report.xfocus.mode,
               report.xfocus.detail);
  }
  goto LAB_0017229f;
}

Assistant:

void process_Xevents(DspInterface dsp)
{
  XEvent report;

  while (XPending(dsp->display_id)) {
    XNextEvent(dsp->display_id, &report);
    if (report.xany.window == dsp->DisplayWindow) /* Try the most important window first. */
      switch (report.type) {
#ifndef INIT
        case MotionNotify:
          *CLastUserActionCell68k = MiscStats->secondstmp;
          *EmCursorX68K = (*((DLword *)EmMouseX68K)) =
              (short)((report.xmotion.x + dsp->Visible.x) & 0xFFFF) - Current_Hot_X;
          *EmCursorY68K = (*((DLword *)EmMouseY68K)) =
              (short)((report.xmotion.y + dsp->Visible.y) & 0xFFFF) - Current_Hot_Y;
          break;
        case KeyPress:
          kb_trans(SUNLispKeyMap[(report.xkey.keycode) - KEYCODE_OFFSET], FALSE);
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case KeyRelease:
          kb_trans(SUNLispKeyMap[(report.xkey.keycode) - KEYCODE_OFFSET], TRUE);
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_LEFT, FALSE); break;
            case Button2: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_MIDDLE, FALSE); break;
            case Button3: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_RIGHT, FALSE); break;
            case Button4: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFT, FALSE); break;
            case Button5: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFTMIDDLE, FALSE); break;
            case Button5 + 1: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHT, FALSE); break;
            case Button5 + 2: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHTMIDDLE, FALSE); break;
            default: break;
          }
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_LEFT, TRUE); break;
            case Button2: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_MIDDLE, TRUE); break;
            case Button3: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_RIGHT, TRUE); break;
            case Button4: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFT, TRUE); break;
            case Button5: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFTMIDDLE, TRUE); break;
            case Button5 + 1: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHT, TRUE); break;
            case Button5 + 2: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHTMIDDLE, TRUE); break;
            default: break;
          }
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case EnterNotify: Mouse_Included = TRUE; break;
        case LeaveNotify: Mouse_Included = FALSE; break;
#endif
        case Expose:
          (dsp->bitblt_to_screen)(dsp, 0, report.xexpose.x + dsp->Visible.x,
                                  report.xexpose.y + dsp->Visible.y, report.xexpose.width,
                                  report.xexpose.height);
          break;
        default: break;
      }
    else if (report.xany.window == dsp->LispWindow)
      switch (report.xany.type) {
        case ConfigureNotify:
          lisp_Xconfigure(dsp, report.xconfigure.x, report.xconfigure.y, (unsigned)report.xconfigure.width,
                          (unsigned)report.xconfigure.height);
          break;
        case EnterNotify: enable_Xkeyboard(currentdsp); break;
        case LeaveNotify: break;
        case MapNotify:
          /* Turn the blitting to the screen on */
          break;
        case UnmapNotify:
          /* Turn the blitting to the screen off */
          break;
        default: break;
      }
    else if (noscroll) continue;
    else if (report.xany.window == dsp->HorScrollBar)
      switch (report.type) {
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, dsp->HorScrollBar, &ScrollLeftCursor);
              ScrollLeft(dsp);
              break;
            case Button2:
              DefineCursor(dsp, dsp->HorScrollBar, &HorizThumbCursor);
              break;
            case Button3:
              DefineCursor(dsp, dsp->HorScrollBar, &ScrollRightCursor);
              ScrollRight(dsp);
              break;
            default: break;
          } /* end switch */
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            case Button2:
              JumpScrollHor(dsp, report.xbutton.x);
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            default: break;
          } /* end switch */
	  break;
        default: break;
      }
    else if (report.xany.window == dsp->VerScrollBar)
      switch (report.type) {
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &ScrollUpCursor);
              ScrollUp(dsp);
              break;
            case Button2:
              DefineCursor(dsp, report.xany.window, &VertThumbCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &ScrollDownCursor);
              ScrollDown(dsp);
              break;
            default: break;
          } /* end switch */
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            case Button2:
              JumpScrollVer(dsp, report.xbutton.y);
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            default: break;
          } /* end switch */
          break;
        default: break;
      }
    else if ((report.xany.window == dsp->NEGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->NEGrav, NorthEastGravity);
    else if ((report.xany.window == dsp->SEGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->SEGrav, SouthEastGravity);
    else if ((report.xany.window == dsp->SWGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->SWGrav, SouthWestGravity);
    else if ((report.xany.window == dsp->NWGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->NWGrav, NorthWestGravity);
    XFlush(dsp->display_id);
  } /* end while */
}